

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelContext.cpp
# Opt level: O1

void __thiscall
amrex::ParallelContext::Frame::local_to_global_rank(Frame *this,int *global,int *local,size_t n)

{
  if (n != 0) {
    memset(global,0,n << 2);
    return;
  }
  return;
}

Assistant:

void
Frame::local_to_global_rank (int* global, const int* local, std::size_t n) const
{
#ifdef BL_USE_MPI
    if (frames.size() > 1)
    {
      MPI_Group_translate_ranks(GroupSub(), n, const_cast<int*>(local), GroupAll(), global);
    }
    else
    {
        for (std::size_t i = 0; i < n; ++i) global[i] = local[i];
    }
#else
    amrex::ignore_unused(local);
    for (std::size_t i = 0; i < n; ++i) global[i] = 0;
#endif
}